

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

int SUNNonlinSolSolve_FixedPoint
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector ycor,N_Vector w,realtype tol,
              int callSetup,void *mem)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_R9;
  undefined8 in_XMM0_Qa;
  N_Vector delta;
  N_Vector gy;
  N_Vector yprev;
  int retval;
  int in_stack_0000006c;
  N_Vector in_stack_00000070;
  N_Vector in_stack_00000078;
  N_Vector in_stack_00000080;
  SUNNonlinearSolver in_stack_00000088;
  N_Vector in_stack_ffffffffffffff98;
  realtype c;
  N_Vector x;
  realtype a;
  int local_4;
  
  if ((((in_RDI == (long *)0x0) || (in_RSI == 0)) || (in_RDX == 0)) ||
     ((in_RCX == 0 || (in_R9 == 0)))) {
    local_4 = -0x385;
  }
  else if ((*(long *)*in_RDI == 0) || (*(long *)(*in_RDI + 8) == 0)) {
    local_4 = -0x385;
  }
  else if ((*(long *)*in_RDI == 0) || (*(long *)(*in_RDI + 8) == 0)) {
    local_4 = -0x385;
  }
  else {
    a = *(realtype *)(*in_RDI + 0x68);
    x = *(N_Vector *)(*in_RDI + 0x70);
    c = *(realtype *)(*in_RDI + 0x88);
    *(undefined8 *)(*in_RDI + 0x98) = 0;
    *(undefined8 *)(*in_RDI + 0xa0) = 0;
    *(undefined4 *)(*in_RDI + 0x90) = 0;
    while (*(int *)(*in_RDI + 0x90) < *(int *)(*in_RDI + 0x94)) {
      N_VScale(c,in_stack_ffffffffffffff98,(N_Vector)0x11796e8);
      iVar1 = (**(code **)*in_RDI)(in_RDX,x,in_R9);
      if (iVar1 != 0) break;
      if (*(int *)(*in_RDI + 0x10) == 0) {
        N_VScale(c,in_stack_ffffffffffffff98,(N_Vector)0x1179739);
      }
      else {
        AndersonAccelerate(in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070,
                           in_stack_0000006c);
      }
      *(long *)(*in_RDI + 0x98) = *(long *)(*in_RDI + 0x98) + 1;
      N_VLinearSum(a,x,c,in_stack_ffffffffffffff98,(N_Vector)0x11797a5);
      iVar1 = (**(code **)(*in_RDI + 8))
                        (in_XMM0_Qa,in_RDI,in_RDX,c,in_RCX,*(undefined8 *)(*in_RDI + 0xa8));
      if (iVar1 == 0) {
        return 0;
      }
      if (iVar1 != 0x385) {
        *(long *)(*in_RDI + 0xa0) = *(long *)(*in_RDI + 0xa0) + 1;
        return iVar1;
      }
      *(int *)(*in_RDI + 0x90) = *(int *)(*in_RDI + 0x90) + 1;
    }
    *(long *)(*in_RDI + 0xa0) = *(long *)(*in_RDI + 0xa0) + 1;
    local_4 = 0x386;
  }
  return local_4;
}

Assistant:

int SUNNonlinSolSolve_FixedPoint(SUNNonlinearSolver NLS, N_Vector y0,
                                 N_Vector ycor, N_Vector w, realtype tol,
                                 booleantype callSetup, void* mem)
{
  /* local variables */
  int retval;
  N_Vector yprev, gy, delta;

  /* check that the inputs are non-null */
  if ( (NLS  == NULL) ||
       (y0   == NULL) ||
       (ycor == NULL) ||
       (w    == NULL) ||
       (mem  == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* check that all required function pointers have been set */
  if ( (FP_CONTENT(NLS)->Sys == NULL) || (FP_CONTENT(NLS)->CTest == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* check that all required function pointers have been set */
  if ( (FP_CONTENT(NLS)->Sys == NULL) || (FP_CONTENT(NLS)->CTest == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* set local shortcut variables */
  yprev = FP_CONTENT(NLS)->yprev;
  gy    = FP_CONTENT(NLS)->gy;
  delta = FP_CONTENT(NLS)->delta;

  /* initialize iteration and convergence fail counters for this solve */
  FP_CONTENT(NLS)->niters     = 0;
  FP_CONTENT(NLS)->nconvfails = 0;

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  /* print current iteration number and the nonlinear residual */
  if (FP_CONTENT(NLS)->print_level && FP_CONTENT(NLS)->info_file
      && (FP_CONTENT(NLS)->info_file != NLS->sunctx->logger->info_fp))
  {
    fprintf(FP_CONTENT(NLS)->info_file,
            "SUNNONLINSOL_FIXEDPOINT (nni=%ld):\n",
            (long int) FP_CONTENT(NLS)->niters);
  }
  SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
    "SUNNonlinSolSolve_FixedPoint", "begin-iteration",
    "iter = %ld, nni = %ld", (long int) 0, FP_CONTENT(NLS)->niters);
#endif

  /* Looping point for attempts at solution of the nonlinear system:
       Evaluate fixed-point function (store in gy).
       Performs the accelerated fixed-point iteration.
       Performs stopping tests. */
  for( FP_CONTENT(NLS)->curiter = 0;
       FP_CONTENT(NLS)->curiter < FP_CONTENT(NLS)->maxiters;
       FP_CONTENT(NLS)->curiter++ ) {

    /* update previous solution guess */
    N_VScale(ONE, ycor, yprev);

    /* compute fixed-point iteration function, store in gy */
    retval = FP_CONTENT(NLS)->Sys(ycor, gy, mem);
    if (retval != SUN_NLS_SUCCESS) break;

    /* perform fixed point update, based on choice of acceleration or not */
    if (FP_CONTENT(NLS)->m == 0) {    /* basic fixed-point solver */
      N_VScale(ONE, gy, ycor);
    } else {                          /* Anderson-accelerated solver */
      retval = AndersonAccelerate(NLS, gy, ycor, yprev, FP_CONTENT(NLS)->curiter);
    }

    /* increment nonlinear solver iteration counter */
    FP_CONTENT(NLS)->niters++;

    /* compute change in solution, and call the convergence test function */
    N_VLinearSum(ONE, ycor, -ONE, yprev, delta);

    /* test for convergence */
    retval = FP_CONTENT(NLS)->CTest(NLS, ycor, delta, tol, w,
                                    FP_CONTENT(NLS)->ctest_data);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    /* print current iteration number and the nonlinear residual */
    if (FP_CONTENT(NLS)->print_level && FP_CONTENT(NLS)->info_file
        && (FP_CONTENT(NLS)->info_file != NLS->sunctx->logger->info_fp))
    {
      fprintf(FP_CONTENT(NLS)->info_file,
              "SUNNONLINSOL_FIXEDPOINT (nni=%ld):\n",
              (long int) FP_CONTENT(NLS)->niters);
    }
    SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
      "SUNNonlinSolSolve_FixedPoint", "end-of-iterate",
      "iter = %ld, nni = %ld, wrmsnorm = %.16g",  (long int) FP_CONTENT(NLS)->curiter,
      FP_CONTENT(NLS)->niters, N_VWrmsNorm(delta, w));
#endif

    /* return if successful */
    if (retval == SUN_NLS_SUCCESS)  return(SUN_NLS_SUCCESS);

    /* check if the iterations should continue; otherwise increment the
       convergence failure count and return error flag */
    if (retval != SUN_NLS_CONTINUE) {
      FP_CONTENT(NLS)->nconvfails++;
      return(retval);
    }

  }

  /* if we've reached this point, then we exhausted the iteration limit;
     increment the convergence failure count and return */
  FP_CONTENT(NLS)->nconvfails++;
  return(SUN_NLS_CONV_RECVR);
}